

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O1

void mpack_tree_init_filename(mpack_tree_t *tree,char *filename,size_t max_bytes)

{
  FILE *stdfile;
  
  if ((long)max_bytes < 0) {
    memset(tree,0,0xa0);
    (tree->nil_node).type = mpack_type_nil;
    *(undefined4 *)&tree->max_size = 0xffffffff;
    *(undefined4 *)((long)&tree->max_size + 4) = 0xffffffff;
    *(undefined4 *)&tree->max_nodes = 0xffffffff;
    *(undefined4 *)((long)&tree->max_nodes + 4) = 0xffffffff;
    tree->error = mpack_error_bug;
  }
  else {
    stdfile = fopen(filename,"rb");
    if (stdfile != (FILE *)0x0) {
      mpack_tree_init_stdfile(tree,(FILE *)stdfile,max_bytes,true);
      return;
    }
    memset(tree,0,0xa0);
    (tree->nil_node).type = mpack_type_nil;
    *(undefined4 *)&tree->max_size = 0xffffffff;
    *(undefined4 *)((long)&tree->max_size + 4) = 0xffffffff;
    *(undefined4 *)&tree->max_nodes = 0xffffffff;
    *(undefined4 *)((long)&tree->max_nodes + 4) = 0xffffffff;
    tree->error = mpack_error_io;
  }
  return;
}

Assistant:

void mpack_tree_init_filename(mpack_tree_t* tree, const char* filename, size_t max_bytes) {
    if (!mpack_tree_file_check_max_bytes(tree, max_bytes))
        return;

    // open the file
    FILE* file = fopen(filename, "rb");
    if (!file) {
        mpack_tree_init_error(tree, mpack_error_io);
        return;
    }

    mpack_tree_init_stdfile(tree, file, max_bytes, true);
}